

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall
slang::ast::ConditionalStatement::serializeTo(ConditionalStatement *this,ASTSerializer *serializer)

{
  Expression *__n;
  long lVar1;
  Condition *cond;
  pointer this_00;
  string_view name;
  
  name._M_str = "conditions";
  name._M_len = 10;
  ASTSerializer::startArray(serializer,name);
  this_00 = (this->conditions).data_;
  for (lVar1 = (this->conditions).size_ << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    ASTSerializer::startObject(serializer);
    __n = not_null<const_slang::ast::Expression_*>::get(&this_00->expr);
    ASTSerializer::write(serializer,4,"expr",(size_t)__n);
    if (this_00->pattern != (Pattern *)0x0) {
      ASTSerializer::write(serializer,7,"pattern",(size_t)this_00->pattern);
    }
    ASTSerializer::endObject(serializer);
    this_00 = this_00 + 1;
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
    return;
  }
  return;
}

Assistant:

void ConditionalStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("conditions");
    for (auto& cond : conditions) {
        serializer.startObject();
        serializer.write("expr", *cond.expr);
        if (cond.pattern)
            serializer.write("pattern", *cond.pattern);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("ifTrue", ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}